

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

void getRGB(Image *image,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,bool isSwitch)

{
  uint8_t uVar1;
  pointer __dest;
  iterator __begin1;
  pointer pCVar2;
  iterator __end1;
  pointer pCVar3;
  long lVar4;
  ulong __n;
  
  __dest = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (ulong)((image->size).width << 2);
  memcpy(__dest,(data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start,__n);
  pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_start;
  pCVar3 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (__n < (ulong)((long)pCVar3 - (long)pCVar2)) {
    lVar4 = 0;
    do {
      (&__dest->r)[__n] =
           (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start[__n] + (&__dest->r)[lVar4];
      __n = __n + 1;
      pCVar2 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar3 = (image->colorData).super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar4 = lVar4 + 1;
    } while (__n < (ulong)((long)pCVar3 - (long)pCVar2));
  }
  if (pCVar2 != pCVar3 && !isSwitch) {
    do {
      uVar1 = pCVar2->b;
      pCVar2->b = pCVar2->r;
      pCVar2->r = uVar1;
      pCVar2 = pCVar2 + 1;
    } while (pCVar2 != pCVar3);
  }
  return;
}

Assistant:

void getRGB(Image &image, const std::vector<uint8_t> &data, bool isSwitch) {
	int scanline = sizeof(Color) * image.size.width;
	uint8_t *start = (uint8_t *)image.colorData.data();
	memcpy(start, data.data(), scanline);
	for (int i = scanline; i < sizeof(Color) * image.colorData.size(); i++) {
		start[i] = start[i - scanline] + data[i];
	}
	if (!isSwitch) { swapBR(image); }
}